

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

QMatchData * __thiscall
QSortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QSortedModelEngine *this,QString *part,
          QModelIndex *parent,int param_3)

{
  ulong uVar1;
  QString part_00;
  QString part_01;
  QString part_02;
  uint uVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  SortOrder SVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  CaseSensitivity CVar17;
  QModelIndex *parent_00;
  long in_FS_OFFSET;
  QCompletionEngine *pQVar18;
  undefined4 in_stack_fffffffffffffe40;
  SortOrder SVar19;
  uint local_1a8;
  uint local_1a4;
  Data *local_180;
  char16_t *local_178;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_170;
  Data *local_168;
  char16_t *local_160;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_158;
  Data *local_150;
  char16_t *local_148;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_140;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  undefined1 local_f8 [8];
  Data *pDStack_f0;
  undefined8 uStack_e8;
  Data *local_d8;
  char16_t *local_d0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_c8;
  QIndexMapper local_c0;
  QMatchData hint;
  undefined1 local_68 [24];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint uStack_48;
  undefined8 local_44;
  undefined1 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar11 = (long *)QAbstractProxyModel::sourceModel();
  hint.indices.v = false;
  hint.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  hint.indices.vector.d.d = (Data *)0x0;
  hint.indices.vector.d.ptr._0_4_ = 0;
  hint.indices.vector.d.ptr._4_4_ = 0;
  hint.indices.vector.d.size._0_4_ = 0;
  hint.indices.vector.d.size._4_4_ = 0;
  hint.indices.f = 0;
  hint.indices.t = -1;
  hint.exactMatchIndex = -1;
  hint.partial = false;
  hint._45_3_ = 0xaaaaaa;
  bVar6 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&hint);
  if (bVar6) {
    QMatchData::QMatchData(__return_storage_ptr__,&hint);
    goto LAB_005d26e2;
  }
  local_c0.v = false;
  local_c0._1_7_ = 0xaaaaaaaaaaaaaa;
  local_c0.vector.d.d = (Data *)0x0;
  local_c0.vector.d.ptr._0_4_ = 0;
  local_c0.vector.d.ptr._4_4_ = 0;
  local_c0.vector.d.size._0_4_ = 0;
  local_c0._28_8_ = 0;
  local_c0.t = -1;
  SVar8 = sortOrder(this,parent);
  bVar6 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&hint);
  if (bVar6) {
    if (hint.indices.v == true) {
      if (CONCAT44(hint.indices.vector.d.size._4_4_,(undefined4)hint.indices.vector.d.size) != 0) {
LAB_005d201e:
        QIndexMapper::operator=(&local_c0,&hint.indices);
        SVar19 = SVar8;
        goto LAB_005d20cb;
      }
    }
    else if (hint.indices.f <= hint.indices.t) goto LAB_005d201e;
    (__return_storage_ptr__->indices).v = false;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
    *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
    __return_storage_ptr__->partial = false;
  }
  else {
    local_d8 = (part->d).d;
    local_d0 = (part->d).ptr;
    local_c8.ptr = (QAbstractItemModel *)(part->d).size;
    if (local_d8 != (Data *)0x0) {
      LOCK();
      (local_d8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (local_d8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part_00.d.ptr._0_4_ = in_stack_fffffffffffffe40;
    part_00.d.d = (Data *)this;
    part_00.d.ptr._4_4_ = SVar8;
    part_00.d.size = (qsizetype)parent;
    SVar19 = SVar8;
    indexHint((QIndexMapper *)local_68,this,part_00,(QModelIndex *)&local_d8,(SortOrder)parent);
    QIndexMapper::operator=(&local_c0,(QIndexMapper *)local_68);
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)(local_68 + 8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
LAB_005d20cb:
    local_f8 = (undefined1  [8])0xffffffffffffffff;
    pDStack_f0 = (Data *)0x0;
    uStack_e8 = 0;
    local_118.size = 0;
    local_118.d = (Data *)0x0;
    local_118.ptr = (char16_t *)0x0;
    uVar12 = (ulong)(local_c0.f - 1);
    iVar10 = local_c0.t + 1;
    while( true ) {
      iVar13 = iVar10;
      iVar10 = (int)uVar12;
      CVar17 = (CaseSensitivity)part;
      if (iVar13 - iVar10 < 2) break;
      bVar6 = SVar8 == AscendingOrder;
      uVar14 = (long)(iVar13 + iVar10) / 2;
      uVar16 = uVar14 & 0xffffffff;
      pQVar18 = &this->super_QCompletionEngine;
      (**(code **)(*plVar11 + 0x60))
                ((QVariant *)local_68,plVar11,uVar16,((this->super_QCompletionEngine).c)->column,
                 parent);
      uStack_e8 = CONCAT44(local_68._20_4_,local_68._16_4_);
      local_f8._4_4_ = local_68._4_4_;
      local_f8._0_4_ = local_68._0_4_;
      pDStack_f0 = (Data *)local_68._8_8_;
      (**(code **)(*plVar11 + 0x90))
                ((QVariant *)local_68,plVar11,local_f8,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      qVar5 = local_118.size;
      pcVar4 = local_118.ptr;
      pDVar3 = local_118.d;
      local_118.d = local_138.d;
      local_118.ptr = local_138.ptr;
      local_138.d = pDVar3;
      local_138.ptr = pcVar4;
      local_118.size = local_138.size;
      local_138.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      ::QVariant::~QVariant((QVariant *)local_68);
      SVar8 = SVar19;
      iVar9 = QString::compare((QString *)&local_118,CVar17);
      iVar10 = (int)uVar14;
      this = (QSortedModelEngine *)pQVar18;
      SVar19 = SVar8;
      if (iVar9 < 0 == bVar6) {
        uVar12 = uVar16;
        iVar10 = iVar13;
      }
    }
    if (SVar8 == AscendingOrder) {
      bVar6 = iVar10 == local_c0.t;
    }
    else {
      bVar6 = iVar13 == local_c0.f;
    }
    if (bVar6) {
      local_150 = (part->d).d;
      local_148 = (part->d).ptr;
      local_140.ptr = (QAbstractItemModel *)(part->d).size;
      if (local_150 != (Data *)0x0) {
        LOCK();
        (local_150->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (local_150->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      parent_00 = (QModelIndex *)&local_150;
LAB_005d2466:
      local_3c = 0;
      local_44 = 0xffffffffffffffff;
      uStack_48 = 0;
      uStack_4c = 0;
      uStack_50 = 0;
      local_68._20_4_ = 0;
      local_68._16_4_ = 0;
      local_68._8_8_ = (Data *)0x0;
      local_68._0_4_ = local_68._0_4_ & 0xffffff00;
      part_01.d.ptr._0_4_ = in_stack_fffffffffffffe40;
      part_01.d.d = (Data *)this;
      part_01.d.ptr._4_4_ = SVar19;
      part_01.d.size = (qsizetype)parent;
      QCompletionEngine::saveInCache
                (&this->super_QCompletionEngine,part_01,parent_00,(QMatchData *)parent);
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)(local_68 + 8));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)parent_00);
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
      *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
      __return_storage_ptr__->partial = false;
    }
    else {
      local_1a4 = iVar10 + 1;
      local_1a8 = iVar13 - 1;
      uVar14 = (ulong)local_1a8;
      uVar12 = uVar14;
      if (SVar8 == AscendingOrder) {
        uVar12 = (ulong)local_1a4;
      }
      (**(code **)(*plVar11 + 0x60))
                (local_68,plVar11,uVar12,((this->super_QCompletionEngine).c)->column,parent);
      uStack_e8 = CONCAT44(local_68._20_4_,local_68._16_4_);
      local_f8._4_4_ = local_68._4_4_;
      local_f8._0_4_ = local_68._0_4_;
      pDStack_f0 = (Data *)local_68._8_8_;
      (**(code **)(*plVar11 + 0x90))
                ((QVariant *)local_68,plVar11,local_f8,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      qVar5 = local_118.size;
      pcVar4 = local_118.ptr;
      pDVar3 = local_118.d;
      local_118.d = local_138.d;
      local_118.ptr = local_138.ptr;
      local_138.d = pDVar3;
      local_138.ptr = pcVar4;
      local_118.size = local_138.size;
      local_138.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      ::QVariant::~QVariant((QVariant *)local_68);
      cVar7 = QString::startsWith((QString *)&local_118,CVar17);
      if (cVar7 == '\0') {
        local_168 = (part->d).d;
        local_160 = (part->d).ptr;
        local_158.ptr = (QAbstractItemModel *)(part->d).size;
        if (local_168 != (Data *)0x0) {
          LOCK();
          (local_168->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (local_168->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        parent_00 = (QModelIndex *)&local_168;
        goto LAB_005d2466;
      }
      iVar10 = QString::compare((QString *)&local_118,CVar17);
      if (SVar8 == AscendingOrder) {
        uVar14 = (ulong)(local_c0.t + 1);
        local_1a8 = 0;
        uVar2 = local_1a4;
      }
      else {
        local_1a4 = 0;
        uVar2 = local_c0.f - 1;
      }
      uVar16 = (ulong)uVar2;
      while( true ) {
        uVar15 = uVar16;
        iVar9 = (int)uVar14;
        iVar13 = (int)uVar15;
        if (iVar9 - iVar13 < 2) break;
        bVar6 = SVar8 == AscendingOrder;
        uVar1 = (long)(iVar9 + iVar13) / 2;
        uVar16 = uVar1 & 0xffffffff;
        pQVar18 = &this->super_QCompletionEngine;
        (**(code **)(*plVar11 + 0x60))
                  ((QVariant *)local_68,plVar11,uVar16,((this->super_QCompletionEngine).c)->column,
                   parent);
        uStack_e8 = CONCAT44(local_68._20_4_,local_68._16_4_);
        local_f8._4_4_ = local_68._4_4_;
        local_f8._0_4_ = local_68._0_4_;
        pDStack_f0 = (Data *)local_68._8_8_;
        (**(code **)(*plVar11 + 0x90))
                  ((QVariant *)local_68,plVar11,local_f8,((this->super_QCompletionEngine).c)->role);
        ::QVariant::toString();
        qVar5 = local_118.size;
        pcVar4 = local_118.ptr;
        pDVar3 = local_118.d;
        local_118.d = local_138.d;
        local_118.ptr = local_138.ptr;
        local_138.d = pDVar3;
        local_138.ptr = pcVar4;
        local_118.size = local_138.size;
        local_138.size = qVar5;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        ::QVariant::~QVariant((QVariant *)local_68);
        SVar8 = SVar19;
        cVar7 = QString::startsWith((QString *)&local_118,CVar17);
        this = (QSortedModelEngine *)pQVar18;
        SVar19 = SVar8;
        if ((bool)cVar7 != bVar6) {
          uVar14 = uVar1 & 0xffffffff;
          uVar16 = uVar15;
        }
      }
      *(undefined1 **)&(__return_storage_ptr__->indices).f = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->exactMatchIndex = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->indices = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = iVar13 + 1;
      local_68._8_8_ = (Data *)0x0;
      local_68._16_4_ = 0;
      local_68._20_4_ = 0;
      if (SVar8 == AscendingOrder) {
        local_1a8 = iVar9 - 1;
        uStack_48 = local_1a4;
      }
      local_68._0_4_ = local_68._0_4_ & 0xffffff00;
      local_44 = CONCAT44(local_44._4_4_,local_1a8);
      QIndexMapper::QIndexMapper(&__return_storage_ptr__->indices,(QIndexMapper *)local_68);
      __return_storage_ptr__->exactMatchIndex = -(uint)(iVar10 != 0) | (uint)uVar12;
      __return_storage_ptr__->partial = false;
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)(local_68 + 8));
      local_180 = (part->d).d;
      local_178 = (part->d).ptr;
      local_170.ptr = (QAbstractItemModel *)(part->d).size;
      if (local_180 != (Data *)0x0) {
        LOCK();
        (local_180->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (local_180->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      part_02.d.ptr._0_4_ = in_stack_fffffffffffffe40;
      part_02.d.d = (Data *)this;
      part_02.d.ptr._4_4_ = SVar19;
      part_02.d.size = (qsizetype)parent;
      QCompletionEngine::saveInCache
                (&this->super_QCompletionEngine,part_02,(QModelIndex *)&local_180,
                 (QMatchData *)parent);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_180);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_c0.vector.d);
LAB_005d26e2:
  QArrayDataPointer<int>::~QArrayDataPointer(&hint.indices.vector.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QMatchData QSortedModelEngine::filter(const QString& part, const QModelIndex& parent, int)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    QMatchData hint;
    if (lookupCache(part, parent, &hint))
        return hint;

    QIndexMapper indices;
    Qt::SortOrder order = sortOrder(parent);

    if (matchHint(part, parent, &hint)) {
        if (!hint.isValid())
            return QMatchData();
        indices = hint.indices;
    } else {
        indices = indexHint(part, parent, order);
    }

    // binary search the model within 'indices' for 'part' under 'parent'
    int high = indices.to() + 1;
    int low = indices.from() - 1;
    int probe;
    QModelIndex probeIndex;
    QString probeData;

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const int cmp = QString::compare(probeData, part, c->cs);
        if ((order == Qt::AscendingOrder && cmp >= 0)
            || (order == Qt::DescendingOrder && cmp < 0)) {
            high = probe;
        } else {
            low = probe;
        }
    }

    if ((order == Qt::AscendingOrder && low == indices.to())
        || (order == Qt::DescendingOrder && high == indices.from())) { // not found
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    probeIndex = model->index(order == Qt::AscendingOrder ? low+1 : high-1, c->column, parent);
    probeData = model->data(probeIndex, c->role).toString();
    if (!probeData.startsWith(part, c->cs)) {
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    const bool exactMatch = QString::compare(probeData, part, c->cs) == 0;
    int emi =  exactMatch ? (order == Qt::AscendingOrder ? low+1 : high-1) : -1;

    int from = 0;
    int to = 0;
    if (order == Qt::AscendingOrder) {
        from = low + 1;
        high = indices.to() + 1;
        low = from;
    } else {
        to = high - 1;
        low = indices.from() - 1;
        high = to;
    }

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const bool startsWith = probeData.startsWith(part, c->cs);
        if ((order == Qt::AscendingOrder && startsWith)
            || (order == Qt::DescendingOrder && !startsWith)) {
            low = probe;
        } else {
            high = probe;
        }
    }

    QMatchData m(order == Qt::AscendingOrder ? QIndexMapper(from, high - 1) : QIndexMapper(low+1, to), emi, false);
    saveInCache(part, parent, m);
    return m;
}